

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

bool __thiscall capnp::_::WirePointer::isDoubleFar(WirePointer *this)

{
  bool bVar1;
  uint uVar2;
  Fault local_48;
  Fault f;
  Kind local_38;
  DebugExpression<capnp::_::WirePointer::Kind> local_34;
  undefined1 local_30 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  WirePointer *this_local;
  
  _kjCondition._24_8_ = this;
  local_38 = kind(this);
  local_34 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
  f.exception._4_4_ = 2;
  kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
            ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_30,
             &local_34,(Kind *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[53]>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xdc,FAILED,"kind() == FAR",
               "_kjCondition,\"isDoubleFar() should only be called on FAR pointers.\"",
               (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_30
               ,(char (*) [53])"isDoubleFar() should only be called on FAR pointers.");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  uVar2 = DirectWireValue<unsigned_int>::get(&this->offsetAndKind);
  return (uVar2 >> 2 & 1) != 0;
}

Assistant:

KJ_ALWAYS_INLINE(bool isDoubleFar() const) {
    KJ_DREQUIRE(kind() == FAR,
        "isDoubleFar() should only be called on FAR pointers.");
    return (offsetAndKind.get() >> 2) & 1;
  }